

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O2

uchar * ZX7_compress(Optimal *optimal,uchar *input_data,size_t input_size,size_t *output_size)

{
  byte *pbVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  uchar uVar5;
  uint uVar6;
  size_t sVar7;
  bool bVar8;
  
  sVar7 = input_size - 1;
  uVar4 = optimal[sVar7].bits + 0x19 >> 3;
  *output_size = uVar4;
  puVar2 = (uchar *)malloc(uVar4);
  output_data = puVar2;
  optimal[sVar7].bits = 0;
  while (sVar7 != 0) {
    uVar4 = (ulong)(uint)optimal[sVar7].len;
    if (optimal[sVar7].len < 2) {
      uVar4 = 1;
    }
    optimal[sVar7 - uVar4].bits = sVar7;
    sVar7 = sVar7 - uVar4;
  }
  bit_mask = 0;
  output_index = 1;
  *puVar2 = *input_data;
  sVar7 = 0;
  do {
    while( true ) {
      sVar7 = optimal[sVar7].bits;
      if (sVar7 == 0) {
        write_bit(1);
        iVar3 = 0x10;
        while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
          write_bit(0);
        }
        write_bit(1);
        return output_data;
      }
      if (optimal[sVar7].len != 0) break;
      write_bit(0);
      uVar5 = input_data[sVar7];
LAB_0010598c:
      puVar2 = output_data + output_index;
      output_index = output_index + 1;
      *puVar2 = uVar5;
    }
    write_bit(1);
    write_elias_gamma(optimal[sVar7].len + -1);
    iVar3 = optimal[sVar7].offset;
    if (iVar3 < 0x81) {
      uVar5 = (char)iVar3 + 0xff;
      goto LAB_0010598c;
    }
    pbVar1 = output_data + output_index;
    output_index = output_index + 1;
    *pbVar1 = (byte)(iVar3 - 0x81U) | 0x80;
    for (uVar6 = 0x400; 0x7f < uVar6; uVar6 = uVar6 >> 1) {
      write_bit(uVar6 & iVar3 - 0x81U);
    }
  } while( true );
}

Assistant:

unsigned char *ZX7_compress(Optimal *optimal, unsigned char *input_data, size_t input_size, size_t *output_size) {
    size_t input_index;
    size_t input_prev;
    int offset1;
    int mask;
    int i;

    /* calculate and allocate output buffer */
    input_index = input_size-1;
    *output_size = (optimal[input_index].bits+18+7)/8;
    output_data = (unsigned char *)MemMalloc(*output_size);

    /* un-reverse optimal sequence */
    optimal[input_index].bits = 0;
    while (input_index > 0) {
        input_prev = input_index - (optimal[input_index].len > 0 ? optimal[input_index].len : 1);
        optimal[input_prev].bits = input_index;
        input_index = input_prev;
    }

    output_index = 0;
    bit_mask = 0;

    /* first byte is always literal */
    write_byte(input_data[0]);

    /* process remaining bytes */
    while ((input_index = optimal[input_index].bits) > 0) {
        if (optimal[input_index].len == 0) {

            /* literal indicator */
            write_bit(0);

            /* literal value */
            write_byte(input_data[input_index]);

        } else {

            /* sequence indicator */
            write_bit(1);

            /* sequence length */
            write_elias_gamma(optimal[input_index].len-1);

            /* sequence offset */
            offset1 = optimal[input_index].offset-1;
            if (offset1 < 128) {
                write_byte(offset1);
            } else {
                offset1 -= 128;
                write_byte((offset1 & 127) | 128);
                for (mask = 1024; mask > 127; mask >>= 1) {
                    write_bit(offset1 & mask);
                }
            }
        }
    }

    /* sequence indicator */
    write_bit(1);

    /* end marker > MAX_LEN */
    for (i = 0; i < 16; i++) {
        write_bit(0);
    }
    write_bit(1);

    return output_data;
}